

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_settings.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::proxy_settings::proxy_settings(proxy_settings *this,settings_pack *sett)

{
  bool bVar1;
  int iVar2;
  
  (this->hostname)._M_dataplus._M_p = (pointer)&(this->hostname).field_2;
  (this->hostname)._M_string_length = 0;
  (this->hostname).field_2._M_local_buf[0] = '\0';
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  (this->username)._M_string_length = 0;
  (this->username).field_2._M_local_buf[0] = '\0';
  (this->password)._M_dataplus._M_p = (pointer)&(this->password).field_2;
  (this->password)._M_string_length = 0;
  (this->password).field_2._M_local_buf[0] = '\0';
  this->type = none;
  this->port = 0;
  this->proxy_hostnames = true;
  this->proxy_peer_connections = true;
  this->proxy_tracker_connections = true;
  settings_pack::get_str_abi_cxx11_(sett,6);
  ::std::__cxx11::string::_M_assign((string *)this);
  settings_pack::get_str_abi_cxx11_(sett,7);
  ::std::__cxx11::string::_M_assign((string *)&this->username);
  settings_pack::get_str_abi_cxx11_(sett,8);
  ::std::__cxx11::string::_M_assign((string *)&this->password);
  iVar2 = settings_pack::get_int(sett,0x407b);
  this->type = (proxy_type_t)iVar2;
  iVar2 = settings_pack::get_int(sett,0x407c);
  this->port = (uint16_t)iVar2;
  bVar1 = settings_pack::get_bool(sett,0x8040);
  this->proxy_hostnames = bVar1;
  bVar1 = settings_pack::get_bool(sett,0x8041);
  this->proxy_peer_connections = bVar1;
  bVar1 = settings_pack::get_bool(sett,0x8043);
  this->proxy_tracker_connections = bVar1;
  return;
}

Assistant:

proxy_settings::proxy_settings(settings_pack const& sett)
{ init(*this, sett); }